

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

word Nf_MatchRefArea(Nf_Man_t *p,int i,int c,Nf_Mat_t *pM,int Required)

{
  int iVar1;
  int iVar2;
  int c_00;
  word wVar3;
  int local_38;
  int k;
  int iLit;
  word Area;
  int Required_local;
  Nf_Mat_t *pM_local;
  int c_local;
  int i_local;
  Nf_Man_t *p_local;
  
  Vec_IntClear(&p->vBackup);
  wVar3 = Nf_MatchRef_rec(p,i,c,pM,Required,&p->vBackup);
  local_38 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(&p->vBackup);
    if (iVar1 <= local_38) {
      return wVar3;
    }
    iVar1 = Vec_IntEntry(&p->vBackup,local_38);
    iVar2 = Abc_Lit2Var(iVar1);
    c_00 = Abc_LitIsCompl(iVar1);
    iVar2 = Nf_ObjMapRefNum(p,iVar2,c_00);
    if (iVar2 < 1) break;
    iVar2 = Abc_Lit2Var(iVar1);
    iVar1 = Abc_LitIsCompl(iVar1);
    Nf_ObjMapRefDec(p,iVar2,iVar1);
    local_38 = local_38 + 1;
  }
  __assert_fail("Nf_ObjMapRefNum(p, Abc_Lit2Var(iLit), Abc_LitIsCompl(iLit)) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                ,0x6da,"word Nf_MatchRefArea(Nf_Man_t *, int, int, Nf_Mat_t *, int)");
}

Assistant:

word Nf_MatchRefArea( Nf_Man_t * p, int i, int c, Nf_Mat_t * pM, int Required )
{
    word Area;  int iLit, k; 
    Vec_IntClear( &p->vBackup );
    Area = Nf_MatchRef_rec( p, i, c, pM, Required, &p->vBackup );
    Vec_IntForEachEntry( &p->vBackup, iLit, k )
    {
        assert( Nf_ObjMapRefNum(p, Abc_Lit2Var(iLit), Abc_LitIsCompl(iLit)) > 0 );
        Nf_ObjMapRefDec( p, Abc_Lit2Var(iLit), Abc_LitIsCompl(iLit) );
    }
    return Area;
}